

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_change_term_val(lyd_node *term,lyd_value *val,ly_bool use_val,ly_bool is_dflt)

{
  lyd_node *plVar1;
  uint uVar2;
  lysc_node *plVar3;
  lyd_node_inner *plVar4;
  lyd_node *plVar5;
  char *pcVar6;
  ly_bool lVar7;
  uint16_t uVar8;
  int iVar9;
  LY_ERR LVar10;
  LY_ERR LVar11;
  lys_module *plVar12;
  lyd_node_inner *node;
  lyd_node_inner *local_38;
  
  plVar3 = term->schema[1].parent;
  plVar1 = term + 1;
  iVar9 = (*(code *)plVar3->parent->next)(term->schema->module->ctx,plVar1,val);
  if (iVar9 == 0) {
    if (use_val != '\0') {
      if (term->schema == (lysc_node *)0x0) {
        plVar12 = (lys_module *)&term[2].schema;
      }
      else {
        plVar12 = term->schema->module;
      }
      (*(code *)plVar3->parent->ref)(plVar12->ctx,val);
    }
  }
  else {
    if ((is_dflt != '\0') && ((term->flags & 1) != 0)) {
      __assert_fail("!(term->flags & LYD_DEFAULT) || !is_dflt",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                    ,0x52d,
                    "LY_ERR lyd_change_term_val(struct lyd_node *, struct lyd_value *, ly_bool, ly_bool)"
                   );
    }
    plVar3 = term->schema;
    node = (lyd_node_inner *)term;
    if ((plVar3->nodetype == 8) ||
       (((plVar3->flags & 0x100) != 0 && (node = term->parent, node != (lyd_node_inner *)0x0)))) {
      plVar4 = (lyd_node_inner *)(node->field_0).node.prev;
      if ((plVar4 == node) ||
         (((plVar3 = (node->field_0).node.schema, (plVar4->field_0).node.schema != plVar3 &&
           ((plVar5 = (node->field_0).node.next, plVar5 == (lyd_node *)0x0 ||
            (plVar3 != plVar5->schema)))) ||
          (lVar7 = lyds_is_supported((lyd_node *)node), lVar7 == '\0')))) {
        lyd_unlink_hash((lyd_node *)node);
        if (term->schema == (lysc_node *)0x0) {
          plVar12 = (lys_module *)&term[2].schema;
        }
        else {
          plVar12 = term->schema->module;
        }
        (*(code *)(term[1].schema)->parent->ref)(plVar12->ctx,plVar1);
        if (use_val == '\0') {
          (*(code *)(term->schema[1].parent)->parent->dsc)(term->schema->module->ctx,val,plVar1);
        }
        else {
          term[1].prev = *(lyd_node **)((long)&val->field_2 + 0x10);
          pcVar6 = val->_canonical;
          plVar3 = (lysc_node *)val->realtype;
          plVar5 = *(lyd_node **)((long)&val->field_2 + 8);
          term[1].parent = (lyd_node_inner *)(val->field_2).dec64;
          term[1].next = plVar5;
          *(char **)plVar1 = pcVar6;
          term[1].schema = plVar3;
        }
      }
      else {
        local_38 = (lyd_node_inner *)lyd_first_sibling((lyd_node *)node);
        if (local_38 == node) {
          local_38 = (lyd_node_inner *)(local_38->field_0).node.next;
        }
        lyd_unlink_tree((lyd_node *)node);
        if (term->schema == (lysc_node *)0x0) {
          plVar12 = (lys_module *)&term[2].schema;
        }
        else {
          plVar12 = term->schema->module;
        }
        (*(code *)(term[1].schema)->parent->ref)(plVar12->ctx,plVar1);
        if (use_val == '\0') {
          (*(code *)(term->schema[1].parent)->parent->dsc)(term->schema->module->ctx,val,plVar1);
        }
        else {
          term[1].prev = *(lyd_node **)((long)&val->field_2 + 0x10);
          pcVar6 = val->_canonical;
          plVar3 = (lysc_node *)val->realtype;
          plVar5 = *(lyd_node **)((long)&val->field_2 + 8);
          term[1].parent = (lyd_node_inner *)(val->field_2).dec64;
          term[1].next = plVar5;
          *(char **)plVar1 = pcVar6;
          term[1].schema = plVar3;
        }
        lyd_insert_node((lyd_node *)0x0,(lyd_node **)&local_38,(lyd_node *)node,0);
      }
      lyd_hash((lyd_node *)node);
      LVar10 = lyd_insert_hash((lyd_node *)node);
LAB_0012c035:
      if (LVar10 != LY_SUCCESS) {
        return LVar10;
      }
    }
    else {
      (*(code *)(term[1].schema)->parent->ref)(plVar3->module->ctx,plVar1);
      if (use_val == '\0') {
        LVar10 = (*(code *)(term->schema[1].parent)->parent->dsc)
                           (term->schema->module->ctx,val,plVar1);
        goto LAB_0012c035;
      }
      term[1].prev = *(lyd_node **)((long)&val->field_2 + 0x10);
      pcVar6 = val->_canonical;
      plVar3 = (lysc_node *)val->realtype;
      plVar5 = *(lyd_node **)((long)&val->field_2 + 8);
      term[1].parent = (lyd_node_inner *)(val->field_2).dec64;
      term[1].next = plVar5;
      *(char **)plVar1 = pcVar6;
      term[1].schema = plVar3;
    }
    if (term->schema == (lysc_node *)0x0) {
      plVar12 = (lys_module *)&term[2].schema;
    }
    else {
      plVar12 = term->schema->module;
    }
    uVar8 = ly_ctx_get_options(plVar12->ctx);
    if ((uVar8 >> 10 & 1) != 0) {
      lyd_free_leafref_nodes((lyd_node_term *)term);
    }
    *(byte *)&term->flags = (byte)term->flags | 4;
  }
  uVar2 = term->flags;
  if (is_dflt == '\0' && (uVar2 & 1) != 0) {
    term->flags = uVar2 & 0xfffffffe;
    lyd_np_cont_dflt_del((lyd_node *)term->parent);
  }
  else {
    if ((uVar2 & 1) != 0 || is_dflt == '\0') {
      LVar10 = LY_ENOT;
      goto LAB_0012c0b5;
    }
    term->flags = uVar2 | 1;
    lyd_np_cont_dflt_set((lyd_node *)term->parent);
  }
  LVar10 = LY_EEXIST;
LAB_0012c0b5:
  LVar11 = LY_SUCCESS;
  if (iVar9 == 0) {
    LVar11 = LVar10;
  }
  return LVar11;
}

Assistant:

LY_ERR
lyd_change_term_val(struct lyd_node *term, struct lyd_value *val, ly_bool use_val, ly_bool is_dflt)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type *type;
    struct lyd_node_term *t;
    ly_bool dflt_change, val_change;

    t = (struct lyd_node_term *)term;
    type = ((struct lysc_node_leaf *)term->schema)->type;

    /* compare original and new value */
    if (type->plugin->compare(LYD_CTX(term), &t->value, val)) {
        /* since they are different, they cannot both be default */
        assert(!(term->flags & LYD_DEFAULT) || !is_dflt);

        /* values differ, switch them */
        LY_CHECK_RET(lyd_change_node_value(t, val, use_val));
        val_change = 1;
    } else {
        /* same values, free the new stored one */
        if (use_val) {
            type->plugin->free(LYD_CTX(term), val);
        }
        val_change = 0;
    }

    /* clear links to leafref nodes */
    if (val_change && (ly_ctx_get_options(LYD_CTX(term)) & LY_CTX_LEAFREF_LINKING)) {
        lyd_free_leafref_nodes(t);
    }

    /* update flags */
    if (val_change) {
        term->flags |= LYD_NEW;
    }
    if ((term->flags & LYD_DEFAULT) && !is_dflt) {
        /* remove dflt flag */
        term->flags &= ~LYD_DEFAULT;

        /* remove parent dflt flag */
        lyd_np_cont_dflt_del(lyd_parent(term));

        dflt_change = 1;
    } else if (!(term->flags & LYD_DEFAULT) && is_dflt) {
        /* add dflt flag */
        term->flags |= LYD_DEFAULT;

        /* add parent dflt flag */
        lyd_np_cont_dflt_set(lyd_parent(term));

        dflt_change = 1;
    } else {
        dflt_change = 0;
    }

    if (!val_change) {
        /* only default flag change or no change */
        rc = dflt_change ? LY_EEXIST : LY_ENOT;
    } /* else value changed, LY_SUCCESS */

    return rc;
}